

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

int sync_update(sync_device *d,int row,sync_cb *cb,void *cb_param)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  _func_void_void_ptr_int *p_Var4;
  uint pos;
  uint uVar5;
  uchar cmd;
  uchar flag;
  uchar type;
  anon_union_4_2_947300a4 v;
  uint32_t new_row;
  uint32_t row_1;
  timeval to;
  track_key key;
  undefined1 local_e7;
  byte local_e6;
  byte local_e5;
  float local_e4;
  void *local_e0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  timeval local_c8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar2 = d->sock;
  if (iVar2 != -1) {
    local_e0 = cb_param;
    local_d4 = row;
    while( true ) {
      local_c8.tv_sec = 0;
      local_c8.tv_usec = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      iVar1 = iVar2 + 0x3f;
      if (-1 < iVar2) {
        iVar1 = iVar2;
      }
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0.0;
      local_b8._8_8_ = 0;
      *(ulong *)(local_b8 + (long)(iVar1 >> 6) * 8) =
           *(ulong *)(local_b8 + (long)(iVar1 >> 6) * 8) | 1L << ((byte)(iVar2 % 0x40) & 0x3f);
      iVar2 = select(iVar2 + 1,(fd_set *)local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
      if (iVar2 < 1) break;
      local_e7 = 0;
      sVar3 = recv(d->sock,&local_e7,1,0);
      if (sVar3 != 1) goto LAB_001a7dec;
      switch(local_e7) {
      case 0:
        iVar2 = d->sock;
        sVar3 = recv(iVar2,&local_c8,4,0);
        if ((((sVar3 == 4) && (sVar3 = recv(iVar2,&local_cc,4,0), sVar3 == 4)) &&
            (sVar3 = recv(iVar2,&local_e4,4,0), sVar3 == 4)) &&
           (sVar3 = recv(iVar2,&local_e5,1,0), sVar3 == 1)) {
          uVar5 = (uint)local_c8.tv_sec >> 0x18 | ((uint)local_c8.tv_sec & 0xff0000) >> 8 |
                  ((uint)local_c8.tv_sec & 0xff00) << 8 | (uint)local_c8.tv_sec << 0x18;
          local_c8.tv_sec = CONCAT44(local_c8.tv_sec._4_4_,uVar5);
          local_e4 = (float)((uint)local_e4 >> 0x18 | ((uint)local_e4 & 0xff0000) >> 8 |
                             ((uint)local_e4 & 0xff00) << 8 | (int)local_e4 << 0x18);
          local_b8._4_4_ = local_e4;
          local_b8._0_4_ =
               local_cc >> 0x18 | (local_cc & 0xff0000) >> 8 | (local_cc & 0xff00) << 8 |
               local_cc << 0x18;
          if ((CONCAT31(0,local_e5) < 4) && ((ulong)uVar5 < d->num_tracks)) {
            local_b8._8_4_ = CONCAT31(0,local_e5);
            iVar2 = sync_set_key(d->tracks[uVar5],(track_key *)local_b8);
            goto LAB_001a7cd4;
          }
        }
        goto LAB_001a7dec;
      case 1:
        iVar2 = d->sock;
        sVar3 = recv(iVar2,(track_key *)local_b8,4,0);
        if ((sVar3 != 4) || (sVar3 = recv(iVar2,&local_c8,4,0), sVar3 != 4)) goto LAB_001a7dec;
        uVar5 = (uint)local_b8._0_4_ >> 0x18 | (local_b8._0_4_ & 0xff0000) >> 8 |
                (local_b8._0_4_ & 0xff00) << 8 | local_b8._0_4_ << 0x18;
        local_b8._0_4_ = uVar5;
        pos = (uint)local_c8.tv_sec >> 0x18 | ((uint)local_c8.tv_sec & 0xff0000) >> 8 |
              ((uint)local_c8.tv_sec & 0xff00) << 8 | (uint)local_c8.tv_sec << 0x18;
        local_c8.tv_sec = CONCAT44(local_c8.tv_sec._4_4_,pos);
        if (d->num_tracks <= (ulong)uVar5) goto LAB_001a7dec;
        iVar2 = sync_del_key(d->tracks[uVar5],pos);
LAB_001a7cd4:
        if (iVar2 != 0) goto LAB_001a7dec;
        break;
      default:
        fprintf(_stderr,"unknown cmd: %02x\n");
        goto LAB_001a7dec;
      case 3:
        sVar3 = recv(d->sock,&local_d0,4,0);
        if (sVar3 != 4) goto LAB_001a7dec;
        if ((cb != (sync_cb *)0x0) &&
           (p_Var4 = cb->set_row, p_Var4 != (_func_void_void_ptr_int *)0x0)) {
          uVar5 = local_d0 >> 0x18 | (local_d0 & 0xff0000) >> 8 | (local_d0 & 0xff00) << 8 |
                  local_d0 << 0x18;
LAB_001a7d46:
          (*p_Var4)(local_e0,uVar5);
        }
        break;
      case 4:
        sVar3 = recv(d->sock,&local_e6,1,0);
        if (sVar3 != 1) goto LAB_001a7dec;
        if ((cb != (sync_cb *)0x0) && (p_Var4 = cb->pause, p_Var4 != (_func_void_void_ptr_int *)0x0)
           ) {
          uVar5 = (uint)local_e6;
          goto LAB_001a7d46;
        }
        break;
      case 5:
        sync_save_tracks(d);
      }
      iVar2 = d->sock;
    }
    if (cb == (sync_cb *)0x0) {
      return 0;
    }
    if (cb->is_playing == (_func_int_void_ptr *)0x0) {
      return 0;
    }
    iVar2 = (*cb->is_playing)(local_e0);
    uVar5 = local_d4;
    if (iVar2 == 0) {
      return 0;
    }
    if (d->row == local_d4) {
      return 0;
    }
    if (d->sock == -1) {
      return 0;
    }
    local_c8.tv_sec = CONCAT71(local_c8.tv_sec._1_7_,3);
    local_b8._0_4_ =
         local_d4 >> 0x18 | (local_d4 & 0xff0000) >> 8 | (local_d4 & 0xff00) << 8 | local_d4 << 0x18
    ;
    sVar3 = send(d->sock,&local_c8,1,0);
    if ((sVar3 == 1) && (sVar3 = send(d->sock,local_b8,4,0), sVar3 == 4)) {
      d->row = uVar5;
      return 0;
    }
LAB_001a7dec:
    close(d->sock);
    d->sock = -1;
  }
  return -1;
}

Assistant:

int sync_update(struct sync_device *d, int row, struct sync_cb *cb,
    void *cb_param)
{
	if (d->sock == INVALID_SOCKET)
		return -1;

	/* look for new commands */
	while (socket_poll(d->sock)) {
		unsigned char cmd = 0, flag;
		uint32_t new_row;
		if (xrecv(d->sock, (char *)&cmd, 1, 0))
			goto sockerr;

		switch (cmd) {
		case SET_KEY:
			if (handle_set_key_cmd(d->sock, d))
				goto sockerr;
			break;
		case DELETE_KEY:
			if (handle_del_key_cmd(d->sock, d))
				goto sockerr;
			break;
		case SET_ROW:
			if (xrecv(d->sock, (char *)&new_row, sizeof(new_row), 0))
				goto sockerr;
			if (cb && cb->set_row)
				cb->set_row(cb_param, ntohl(new_row));
			break;
		case PAUSE:
			if (xrecv(d->sock, (char *)&flag, 1, 0))
				goto sockerr;
			if (cb && cb->pause)
				cb->pause(cb_param, flag);
			break;
		case SAVE_TRACKS:
			sync_save_tracks(d);
			break;
		default:
			fprintf(stderr, "unknown cmd: %02x\n", cmd);
			goto sockerr;
		}
	}

	if (cb && cb->is_playing && cb->is_playing(cb_param)) {
		if (d->row != row && d->sock != INVALID_SOCKET) {
			unsigned char cmd = SET_ROW;
			uint32_t nrow = htonl(row);
			if (xsend(d->sock, (char*)&cmd, 1, 0) ||
			    xsend(d->sock, (char*)&nrow, sizeof(nrow), 0))
				goto sockerr;
			d->row = row;
		}
	}
	return 0;

sockerr:
	closesocket(d->sock);
	d->sock = INVALID_SOCKET;
	return -1;
}